

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ComputePipeline::recordCommands
          (ComputePipeline *this,OperationContext *context,VkCommandBuffer cmdBuffer,
          VkDescriptorSet descriptorSet)

{
  DeviceInterface *pDVar1;
  VkDescriptorSet descriptorSet_local;
  
  pDVar1 = context->m_vk;
  descriptorSet_local = descriptorSet;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,cmdBuffer,1,
             (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
             m_internal);
  (*pDVar1->_vptr_DeviceInterface[0x56])
            (pDVar1,cmdBuffer,1,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,0,1,&descriptorSet_local,0,0);
  if (this->m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT) {
    (*pDVar1->_vptr_DeviceInterface[0x5e])
              (pDVar1,cmdBuffer,
               (deUint64)
               (((this->m_indirectBuffer).
                 super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                 .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
               ,0);
  }
  else {
    (*pDVar1->_vptr_DeviceInterface[0x5d])(pDVar1,cmdBuffer,1,1,1);
  }
  return;
}

Assistant:

void recordCommands (OperationContext& context, const VkCommandBuffer cmdBuffer, const VkDescriptorSet descriptorSet)
	{
		const DeviceInterface&	vk	= context.getDeviceInterface();

		vk.cmdBindPipeline(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipeline);
		vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

		if (m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT)
			vk.cmdDispatchIndirect(cmdBuffer, **m_indirectBuffer, 0u);
		else
			vk.cmdDispatch(cmdBuffer, 1u, 1u, 1u);
	}